

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslayoutitem.cpp
# Opt level: O2

bool __thiscall QGraphicsLayoutItemPrivate::hasHeightForWidth(QGraphicsLayoutItemPrivate *this)

{
  QGraphicsLayoutItem *pQVar1;
  QGraphicsItem *this_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  QGraphicsLayout *pQVar5;
  undefined4 extraout_var;
  QGraphicsLayout *l;
  
  while (pQVar1 = this->q_ptr, (this->field_0xb0 & 4) == 0) {
    this_00 = ((pQVar1->d_ptr).d)->graphicsItem;
    if ((this_00 == (QGraphicsItem *)0x0) || (bVar2 = QGraphicsItem::isWidget(this_00), !bVar2))
    goto LAB_0058b9b0;
    pQVar5 = QGraphicsWidget::layout((QGraphicsWidget *)(this_00 + -1));
    if (pQVar5 == (QGraphicsLayout *)0x0) goto LAB_0058b9b0;
    pQVar5 = QGraphicsWidget::layout((QGraphicsWidget *)(this_00 + -1));
    this = (pQVar5->super_QGraphicsLayoutItem).d_ptr.d;
  }
  uVar3 = (*pQVar1->_vptr_QGraphicsLayoutItem[9])(pQVar1);
  while (0 < (int)uVar3) {
    uVar3 = uVar3 - 1;
    iVar4 = (*pQVar1->_vptr_QGraphicsLayoutItem[10])(pQVar1,(ulong)uVar3);
    bVar2 = hasHeightForWidth(*(QGraphicsLayoutItemPrivate **)(CONCAT44(extraout_var,iVar4) + 8));
    if (bVar2) {
      return true;
    }
  }
LAB_0058b9b0:
  return (bool)((*(byte *)((long)&(((pQVar1->d_ptr).d)->sizePolicy).field_0 + 3) & 0x20) >> 5);
}

Assistant:

bool QGraphicsLayoutItemPrivate::hasHeightForWidth() const
{
    Q_Q(const QGraphicsLayoutItem);
    if (isLayout) {
        const QGraphicsLayout *l = static_cast<const QGraphicsLayout *>(q);
        for (int i = l->count() - 1; i >= 0; --i) {
            if (QGraphicsLayoutItemPrivate::get(l->itemAt(i))->hasHeightForWidth())
                return true;
        }
    } else if (QGraphicsItem *item = q->graphicsItem()) {
        if (item->isWidget()) {
            QGraphicsWidget *w = static_cast<QGraphicsWidget *>(item);
            if (w->layout()) {
                return QGraphicsLayoutItemPrivate::get(w->layout())->hasHeightForWidth();
            }
        }
    }
    return q->sizePolicy().hasHeightForWidth();
}